

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::detail::bson_uint128_divide1B
          (detail *this,bson_uint128_t value,bson_uint128_t *quotient,uint32_t *rem)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  long lVar5;
  bson_uint128_t value_local;
  
  puVar4 = value.parts._8_8_;
  lVar5 = value.parts._0_8_;
  value_local.parts._0_8_ = this;
  value_local.parts[2] = (int)lVar5;
  value_local.parts[3] = (int)((ulong)lVar5 >> 0x20);
  if (this == (detail *)0x0 && lVar5 == 0) {
    *(detail **)puVar4 = this;
    *(long *)(puVar4 + 2) = lVar5;
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    for (lVar5 = 0; uVar3 = (uint32_t)uVar2, lVar5 != 4; lVar5 = lVar5 + 1) {
      uVar2 = (ulong)value_local.parts[lVar5] | uVar2 << 0x20;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar2 = uVar2 % 1000000000;
      value_local.parts[lVar5] = SUB164(auVar1 / ZEXT816(1000000000),0);
    }
    *(undefined8 *)puVar4 = value_local.parts._0_8_;
    *(undefined8 *)(puVar4 + 2) = value_local.parts._8_8_;
  }
  quotient->parts[0] = uVar3;
  return;
}

Assistant:

inline
        void bson_uint128_divide1B (bson_uint128_t value,     /* IN */
                                     bson_uint128_t *quotient, /* OUT */
                                     uint32_t *rem)             /* OUT */
        {
            const uint32_t DIVISOR = 1000 * 1000 * 1000;
            uint64_t _rem = 0;
            int i = 0;
            
            if (!value.parts[0] && !value.parts[1] && !value.parts[2] &&
                !value.parts[3]) {
               *quotient = value;
               *rem = 0;
               return;
            }
            
            for (i = 0; i <= 3; i++) {
               _rem <<= 32; /* Adjust remainder to match value of next dividend */
               _rem += value.parts[i]; /* Add the divided to _rem */
               value.parts[i] = (uint32_t) (_rem / DIVISOR);
               _rem %= DIVISOR; /* Store the remainder */
            }
            
            *quotient = value;
            *rem = (uint32_t) _rem;
        }